

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSharedMemoryWaitableObject::GetSynchStateController
          (CSharedMemoryWaitableObject *this,CPalThread *pthr,
          ISynchStateController **ppStateController)

{
  PAL_ERROR PVar1;
  PAL_ERROR palError;
  ISynchStateController **ppStateController_local;
  CPalThread *pthr_local;
  CSharedMemoryWaitableObject *this_local;
  
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","GetSynchStateController",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x548);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (ppStateController == (ISynchStateController **)0x0) {
    fprintf(_stderr,"] %s %s:%d","GetSynchStateController",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x549);
    fprintf(_stderr,"Expression: NULL != ppStateController\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  (**(code **)(*g_pSynchronizationManager + 0x50))(g_pSynchronizationManager,pthr);
  PVar1 = (**(code **)(*g_pSynchronizationManager + 0x60))
                    (g_pSynchronizationManager,pthr,
                     (this->super_CSharedMemoryObject).super_CPalObjectBase.m_pot,
                     this->m_pvSynchData,(this->super_CSharedMemoryObject).m_ObjectDomain,
                     ppStateController);
  (**(code **)(*g_pSynchronizationManager + 0x58))(g_pSynchronizationManager,pthr);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return PVar1;
}

Assistant:

PAL_ERROR
CSharedMemoryWaitableObject::GetSynchStateController(
    CPalThread *pthr,                // IN, OPTIONAL
    ISynchStateController **ppStateController    // OUT
    )
{
    PAL_ERROR palError = NO_ERROR;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != ppStateController);

    ENTRY("CSharedMemoryWaitableObject::GetSynchStateController"
        "(this = %p, pthr = %p, ppStateController = %p",
        this,
        pthr,
        ppStateController
        );

    //
    // We need to grab the local synch lock before creating the controller
    // (otherwise we could get promoted after passing in our parameters)
    //

    g_pSynchronizationManager->AcquireProcessLock(pthr);
    
    palError = g_pSynchronizationManager->CreateSynchStateController(
        pthr,
        m_pot,
        m_pvSynchData,
        m_ObjectDomain,
        ppStateController
        );

    g_pSynchronizationManager->ReleaseProcessLock(pthr);

    LOGEXIT("CSharedMemoryWaitableObject::GetSynchStateController returns %d\n",
        palError
        );

    return palError;
}